

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O2

string * __thiscall
cmServerBufferStrategy::BufferOutMessage
          (string *__return_storage_ptr__,cmServerBufferStrategy *this,string *rawBuffer)

{
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,"\n",&local_f9);
  std::operator+(&local_b8,&local_38,&kSTART_MAGIC_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_d8,"\n",&local_fa);
  std::operator+(&local_98,&local_b8,&local_d8);
  std::operator+(&local_78,&local_98,rawBuffer);
  std::operator+(&local_58,&local_78,&kEND_MAGIC_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_f8,"\n",&local_fb);
  std::operator+(__return_storage_ptr__,&local_58,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmServerBufferStrategy::BufferOutMessage(
  const std::string& rawBuffer) const
{
  return std::string("\n") + kSTART_MAGIC + std::string("\n") + rawBuffer +
    kEND_MAGIC + std::string("\n");
}